

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

RemoteProducer * __thiscall
perfetto::ProducerIPCService::GetProducerForCurrentRequest(ProducerIPCService *this)

{
  ulong uVar1;
  ScopedFile *pSVar2;
  uint uVar3;
  undefined8 uVar4;
  int iVar5;
  RemoteProducer *extraout_RAX;
  RemoteProducer *pRVar6;
  char *fname;
  RemoteProducer *extraout_RAX_00;
  undefined4 extraout_var;
  RemoteProducer *extraout_RAX_01;
  undefined4 extraout_var_00;
  undefined8 extraout_RAX_02;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  DeferredBase *this_00;
  long in_RSI;
  _Rb_tree_header *p_Var9;
  long *unaff_R12;
  ProducerEndpoint *pPVar10;
  ScopedResource<int,_&perfetto::base::CloseFile,__1,_true,_perfetto::base::internal::DefaultValidityChecker<int,__1>_>
  SStack_7c;
  _Head_base<0UL,_perfetto::ProducerIPCService::RemoteProducer_*,_false> _Stack_78;
  undefined1 auStack_70 [20];
  ScopedFile SStack_5c;
  ProducerEndpoint *pPStack_58;
  undefined1 auStack_50 [16];
  ulong uStack_40;
  
  uVar1 = (this->super_ProducerPort).super_Service.client_info_.client_id_;
  if (uVar1 != 0) {
    p_Var9 = &(this->producers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = (this->producers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var9->_M_header;
    for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uVar1]) {
      if (*(ulong *)(p_Var8 + 1) >= uVar1) {
        p_Var7 = p_Var8;
      }
    }
    p_Var8 = &p_Var9->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var9) && (p_Var8 = p_Var7, uVar1 < *(ulong *)(p_Var7 + 1)))
    {
      p_Var8 = &p_Var9->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 == p_Var9) {
      pRVar6 = (RemoteProducer *)0x0;
    }
    else {
      pRVar6 = (RemoteProducer *)p_Var8[1]._M_parent;
    }
    return pRVar6;
  }
  GetProducerForCurrentRequest();
  uStack_40 = (this->super_ProducerPort).super_Service.client_info_.client_id_;
  if (uStack_40 != 0) {
    p_Var9 = &(this->producers_)._M_t._M_impl.super__Rb_tree_header;
    p_Var8 = (this->producers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var9->_M_header;
    for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(ulong *)(p_Var8 + 1) < uStack_40]
        ) {
      if (*(ulong *)(p_Var8 + 1) >= uStack_40) {
        p_Var7 = p_Var8;
      }
    }
    p_Var8 = &p_Var9->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var9) &&
       (p_Var8 = p_Var7, uStack_40 < *(ulong *)(p_Var7 + 1))) {
      p_Var8 = &p_Var9->_M_header;
    }
    if ((_Rb_tree_header *)p_Var8 != p_Var9) {
      ipc::DeferredBase::Reject(this_00);
      return extraout_RAX;
    }
    pRVar6 = (RemoteProducer *)operator_new(0x38);
    RemoteProducer::RemoteProducer(pRVar6);
    uVar3 = (uint)(*(int *)(in_RSI + 0x30) == 2) * 2;
    if (*(int *)(in_RSI + 0x30) == 1) {
      uVar3 = 1;
    }
    _Stack_78._M_head_impl = pRVar6;
    if (*(char *)(in_RSI + 0x34) == '\0') {
      pPVar10 = (ProducerEndpoint *)0x0;
    }
    else {
      pSVar2 = (this->super_ProducerPort).super_Service.received_fd_;
      if (pSVar2 == (ScopedFile *)0x0) {
        SStack_7c.t_ = -1;
      }
      else {
        SStack_7c.t_ = pSVar2->t_;
        pSVar2->t_ = -1;
      }
      if (SStack_7c.t_ == -1) {
        pPVar10 = (ProducerEndpoint *)0x0;
      }
      else {
        SStack_5c.t_ = SStack_7c.t_;
        SStack_7c.t_ = -1;
        PosixSharedMemory::AttachToFd((PosixSharedMemory *)auStack_70,&SStack_5c,true);
        pPVar10 = (ProducerEndpoint *)auStack_70._0_8_;
        auStack_70._0_8_ = (ProducerEndpoint *)0x0;
        base::
        ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
        ::reset(&SStack_5c,-1);
        if (pPVar10 == (ProducerEndpoint *)0x0) {
          fname = base::Basename(
                                "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                                );
          base::LogMessage(kLogError,fname,0x12160,
                           "Couldn\'t map producer-provided SMB, falling back to service-provided SMB"
                          );
        }
      }
      base::
      ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
      ::reset(&SStack_7c,-1);
    }
    pPStack_58 = pPVar10;
    (*this->core_service_->_vptr_TracingService[2])
              (auStack_70,this->core_service_,_Stack_78._M_head_impl,
               (ulong)(this->super_ProducerPort).super_Service.client_info_.uid_,
               (ulong)(uint)(this->super_ProducerPort).super_Service.client_info_.pid_,in_RSI + 0x10
               ,(ulong)*(uint *)(in_RSI + 0xc),0,(ulong)uVar3,(ulong)*(uint *)(in_RSI + 8),
               &pPStack_58,in_RSI + 0x38);
    uVar4 = auStack_70._0_8_;
    auStack_70._0_8_ = (_func_int **)0x0;
    pPVar10 = ((_Stack_78._M_head_impl)->service_endpoint)._M_t.
              super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
              ._M_t.
              super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
              .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl;
    ((_Stack_78._M_head_impl)->service_endpoint)._M_t.
    super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
    ._M_t.
    super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
    .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl =
         (ProducerEndpoint *)uVar4;
    if (pPVar10 != (ProducerEndpoint *)0x0) {
      (*pPVar10->_vptr_ProducerEndpoint[1])();
    }
    if ((_func_int **)auStack_70._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)auStack_70._0_8_ + 8))();
    }
    auStack_70._0_8_ = (_func_int **)0x0;
    if (pPStack_58 != (ProducerEndpoint *)0x0) {
      (*pPStack_58->_vptr_ProducerEndpoint[1])();
    }
    pPStack_58 = (ProducerEndpoint *)0x0;
    pPVar10 = ((_Stack_78._M_head_impl)->service_endpoint)._M_t.
              super___uniq_ptr_impl<perfetto::ProducerEndpoint,_std::default_delete<perfetto::ProducerEndpoint>_>
              ._M_t.
              super__Tuple_impl<0UL,_perfetto::ProducerEndpoint_*,_std::default_delete<perfetto::ProducerEndpoint>_>
              .super__Head_base<0UL,_perfetto::ProducerEndpoint_*,_false>._M_head_impl;
    if (pPVar10 == (ProducerEndpoint *)0x0) {
      ipc::DeferredBase::Reject(this_00);
      pRVar6 = extraout_RAX_01;
    }
    else {
      iVar5 = (*pPVar10->_vptr_ProducerEndpoint[0xc])();
      ::std::
      _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>>>
      ::
      _M_emplace_unique<unsigned_long_const&,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>
                ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>,std::_Select1st<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::unique_ptr<perfetto::ProducerIPCService::RemoteProducer,std::default_delete<perfetto::ProducerIPCService::RemoteProducer>>>>>
                  *)&this->producers_,&uStack_40,
                 (unique_ptr<perfetto::ProducerIPCService::RemoteProducer,_std::default_delete<perfetto::ProducerIPCService::RemoteProducer>_>
                  *)&_Stack_78);
      ipc::AsyncResult<perfetto::protos::gen::InitializeConnectionResponse>::Create();
      *(char *)(auStack_70._0_8_ + 8) = (char)iVar5;
      *(undefined1 *)(auStack_70._0_8_ + 9) = 1;
      *(byte *)(auStack_70._0_8_ + 0x30) = *(byte *)(auStack_70._0_8_ + 0x30) | 6;
      auStack_50._0_8_ = auStack_70._0_8_;
      auStack_50._8_8_ = auStack_70._8_8_;
      auStack_70._0_8_ = (_func_int **)0x0;
      ipc::Deferred<perfetto::protos::gen::InitializeConnectionResponse>::Resolve
                ((Deferred<perfetto::protos::gen::InitializeConnectionResponse> *)this_00,
                 (AsyncResult<perfetto::protos::gen::InitializeConnectionResponse> *)auStack_50);
      pRVar6 = extraout_RAX_00;
      if ((_Head_base<0UL,_perfetto::protos::gen::InitializeConnectionResponse_*,_false>)
          auStack_50._0_8_ !=
          (_Head_base<0UL,_perfetto::protos::gen::InitializeConnectionResponse_*,_false>)0x0) {
        iVar5 = (*((CppMessageObj *)auStack_50._0_8_)->_vptr_CppMessageObj[1])();
        pRVar6 = (RemoteProducer *)CONCAT44(extraout_var,iVar5);
      }
      auStack_50._0_8_ =
           (_Tuple_impl<0UL,_perfetto::protos::gen::InitializeConnectionResponse_*,_std::default_delete<perfetto::protos::gen::InitializeConnectionResponse>_>
            )0x0;
      if ((_func_int **)auStack_70._0_8_ != (_func_int **)0x0) {
        pRVar6 = (RemoteProducer *)(**(code **)(*(_func_int **)auStack_70._0_8_ + 8))();
      }
    }
    if (_Stack_78._M_head_impl != (RemoteProducer *)0x0) {
      iVar5 = (*((_Stack_78._M_head_impl)->super_Producer)._vptr_Producer[1])();
      pRVar6 = (RemoteProducer *)CONCAT44(extraout_var_00,iVar5);
    }
    return pRVar6;
  }
  InitializeConnection();
  base::
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::~ScopedResource(&SStack_7c);
  if (unaff_R12 != (long *)0x0) {
    (**(code **)(*unaff_R12 + 8))();
  }
  if (_Stack_78._M_head_impl != (RemoteProducer *)0x0) {
    (*((_Stack_78._M_head_impl)->super_Producer)._vptr_Producer[1])();
  }
  _Stack_78._M_head_impl = (RemoteProducer *)0x0;
  _Unwind_Resume(extraout_RAX_02);
}

Assistant:

ProducerIPCService::RemoteProducer*
ProducerIPCService::GetProducerForCurrentRequest() {
  const ipc::ClientID ipc_client_id = ipc::Service::client_info().client_id();
  PERFETTO_CHECK(ipc_client_id);
  auto it = producers_.find(ipc_client_id);
  if (it == producers_.end())
    return nullptr;
  return it->second.get();
}